

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::notationDecl
          (AbstractDOMParser *this,XMLNotationDecl *notDecl,bool param_2)

{
  DOMDocumentImpl *pDVar1;
  XMLBuffer *this_00;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  XMLCh *chars;
  XMLCh *id;
  bool publicKeywordPrinted;
  DOMNode *rem;
  DOMNotationImpl *notation;
  bool param_2_local;
  XMLNotationDecl *notDecl_local;
  AbstractDOMParser *this_local;
  long *plVar5;
  
  pDVar1 = this->fDocument;
  pXVar4 = XMLNotationDecl::getName(notDecl);
  iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3c])(pDVar1,pXVar4);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  pXVar4 = XMLNotationDecl::getPublicId(notDecl);
  (**(code **)(*plVar5 + 0x160))(plVar5,pXVar4);
  pXVar4 = XMLNotationDecl::getSystemId(notDecl);
  (**(code **)(*plVar5 + 0x168))(plVar5,pXVar4);
  pXVar4 = XMLNotationDecl::getBaseURI(notDecl);
  (**(code **)(*plVar5 + 0x170))(plVar5,pXVar4);
  iVar3 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x2a])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar3),plVar5);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x138))();
  }
  bVar2 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar2) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'!');
    XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNotationString);
    XMLBuffer::append(this->fInternalSubset,L' ');
    this_00 = this->fInternalSubset;
    pXVar4 = XMLNotationDecl::getName(notDecl);
    XMLBuffer::append(this_00,pXVar4);
    pXVar4 = (XMLCh *)(**(code **)(*plVar5 + 0x140))();
    if (pXVar4 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar4);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    chars = (XMLCh *)(**(code **)(*plVar5 + 0x148))();
    if (chars != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      if (pXVar4 == (XMLCh *)0x0) {
        XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
        XMLBuffer::append(this->fInternalSubset,L' ');
      }
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,chars);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
    XMLBuffer::append(this->fInternalSubset,L'>');
  }
  return;
}

Assistant:

void AbstractDOMParser::notationDecl
(
    const   XMLNotationDecl&    notDecl
    , const bool
)
{
    DOMNotationImpl* notation = (DOMNotationImpl *)fDocument->createNotation(notDecl.getName());
    notation->setPublicId(notDecl.getPublicId());
    notation->setSystemId(notDecl.getSystemId());
    notation->setBaseURI(notDecl.getBaseURI());

    DOMNode* rem = fDocumentType->getNotations()->setNamedItem( notation );
    if (rem)
        rem->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgNotationString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(notDecl.getName());

        bool publicKeywordPrinted = false;

        const XMLCh* id = notation->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

            publicKeywordPrinted = true;
        }
        id = notation->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);

            if ( !publicKeywordPrinted ){
				fInternalSubset.append(XMLUni::fgSysIDString);
				fInternalSubset.append(chSpace);
			}

            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        fInternalSubset.append(chCloseAngle);
    }
}